

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[12],pstack::Dwarf::LineInfo,char>
          (JObject *this,char (*k) [12],LineInfo *v,char *c)

{
  ostream *os;
  char (*local_40) [12];
  Field<char[12],_pstack::Dwarf::LineInfo> field;
  
  local_40 = k;
  field.k = &v->default_is_stmt;
  os = std::operator<<(this->os,this->sep);
  field.v = (LineInfo *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[12],_pstack::Dwarf::LineInfo>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }